

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O3

apx_error_t serializer_pack_record_value(apx_vm_serializer_t *self)

{
  uint32_t uVar1;
  uint32_t uVar2;
  apx_error_t aVar3;
  dtl_dv_t *dv;
  apx_vm_writeState_t *paVar4;
  
  paVar4 = self->state;
  if (paVar4 == (apx_vm_writeState_t *)0x0) {
    __assert_fail("(self != NULL) && (self->state != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                  ,0x5fb,"apx_error_t serializer_pack_record_value(apx_vm_serializer_t *)");
  }
  uVar1 = paVar4->array_len;
  if (uVar1 != 0) {
    if (paVar4->value_type != DTL_DV_ARRAY) {
      return 0x43;
    }
    if (paVar4->dynamic_size_type == '\0') {
      uVar2 = dtl_av_length((paVar4->value).av);
      if (uVar1 != uVar2) {
        return 0x46;
      }
      paVar4 = self->state;
    }
    if (paVar4->index != 0) {
      __assert_fail("self->state->index == 0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x60b,"apx_error_t serializer_pack_record_value(apx_vm_serializer_t *)");
    }
    dv = dtl_av_value((paVar4->value).av,0);
    if (dv == (dtl_dv_t *)0x0) {
      return 0x24;
    }
    aVar3 = serializer_enter_new_child_state(self);
    if (aVar3 != 0) {
      return aVar3;
    }
    state_set_value(self->state,dv);
    paVar4 = self->state;
  }
  aVar3 = 0x43;
  if (paVar4->value_type == DTL_DV_HASH) {
    aVar3 = 0;
  }
  return aVar3;
}

Assistant:

static apx_error_t serializer_pack_record_value(apx_vm_serializer_t* self)
{
   assert((self != NULL) && (self->state != NULL) );
   uint32_t const expected_array_len = self->state->array_len;
   if (expected_array_len > 0)
   {
      if (self->state->value_type == DTL_DV_ARRAY)
      {
         if (self->state->dynamic_size_type == APX_SIZE_TYPE_NONE)
         {
            //For non-dynamic arrays the length of the value must match exactly.
            uint32_t const value_array_length = (uint32_t) dtl_av_length(self->state->value.av);
            if (expected_array_len != value_array_length)
            {
               return APX_VALUE_LENGTH_ERROR;
            }
         }
         //select the first array value in a new child state.
         assert(self->state->index == 0u);
         dtl_dv_t const* child_value = dtl_av_value(self->state->value.av, (int32_t) self->state->index);

         if (child_value == NULL)
         {
            return APX_NULL_PTR_ERROR;
         }
         apx_error_t result = serializer_enter_new_child_state(self);
         if (result != APX_NO_ERROR)
         {
            return result;
         }
         state_set_value(self->state, child_value); //self->state on this line is the newly entered child_state
      }
      else
      {
         return APX_VALUE_TYPE_ERROR;
      }
   }
   if (self->state->value_type != DTL_DV_HASH) //This check applies to both top-level state as well as (potentially newly entered) child-state
   {
      return APX_VALUE_TYPE_ERROR;
   }
   return APX_NO_ERROR;
}